

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr * filemgr_get_instance(char *filename)

{
  filemgr *pfVar1;
  filemgr *file;
  char *in_stack_000002e8;
  
  pthread_spin_lock(&filemgr_openlock);
  pfVar1 = get_instance_UNLOCKED(in_stack_000002e8);
  pthread_spin_unlock(&filemgr_openlock);
  return pfVar1;
}

Assistant:

struct filemgr* filemgr_get_instance(const char* filename)
{
    spin_lock(&filemgr_openlock);
    struct filemgr *file = get_instance_UNLOCKED(filename);
    spin_unlock(&filemgr_openlock);

    return file;
}